

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

Array<capnp::Schema> * __thiscall
capnp::SchemaLoader::getAllLoaded(Array<capnp::Schema> *__return_storage_ptr__,SchemaLoader *this)

{
  Own<capnp::SchemaLoader::Impl> *this_00;
  Impl *this_01;
  Locked<const_kj::Own<capnp::SchemaLoader::Impl>_> local_28;
  SchemaLoader *local_18;
  SchemaLoader *this_local;
  
  local_18 = this;
  this_local = (SchemaLoader *)__return_storage_ptr__;
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_>::lockShared
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_> *)&local_28);
  this_00 = kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl>_>::operator->(&local_28);
  this_01 = kj::Own<capnp::SchemaLoader::Impl>::get(this_00);
  Impl::getAllLoaded(__return_storage_ptr__,this_01);
  kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl>_>::~Locked(&local_28);
  return __return_storage_ptr__;
}

Assistant:

kj::Array<Schema> SchemaLoader::getAllLoaded() const {
  return impl.lockShared()->get()->getAllLoaded();
}